

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *
capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise
          (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,
          Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *promise)

{
  SourceLocation location;
  TypeByIndex<0UL,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  *t;
  Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *promise_00;
  TypeByIndex<1UL,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  *t_00;
  Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> *promise_01;
  Own<capnp::PipelineHook,_std::nullptr_t> local_c8;
  Pipeline local_b8;
  Pipeline local_90;
  SourceLocation local_50;
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  local_30;
  undefined1 local_28 [8];
  Tuple<kj::Promise<Response<GetCapResults>_>,_kj::Promise<kj::Own<PipelineHook>_>_> splitPromise;
  Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
  *promise_local;
  
  splitPromise.impl.
  super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>.value.
  super_PromiseBase.node.ptr =
       (Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>)
       (Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>)promise;
  kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>::
  then<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_>
            ((Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>
              *)&local_30,(Type *)promise);
  kj::SourceLocation::SourceLocation
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h"
             ,"reducePromise",0x428,7);
  location.function = local_50.function;
  location.fileName = local_50.fileName;
  location.lineNumber = local_50.lineNumber;
  location.columnNumber = local_50.columnNumber;
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  ::split((Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
           *)local_28,location);
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  ::~Promise(&local_30);
  t = kj::
      get<0ul,kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Promise<kj::Own<capnp::PipelineHook,decltype(nullptr)>>>&>
                ((Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
                  *)local_28);
  promise_00 = kj::
               mv<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
                         (t);
  t_00 = kj::
         get<1ul,kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Promise<kj::Own<capnp::PipelineHook,decltype(nullptr)>>>&>
                   ((Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
                     *)local_28);
  promise_01 = kj::mv<kj::Promise<kj::Own<capnp::PipelineHook,decltype(nullptr)>>>(t_00);
  newLocalPromisePipeline((capnp *)&local_c8,promise_01);
  AnyPointer::Pipeline::Pipeline(&local_b8,&local_c8);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::Pipeline(&local_90,&local_b8);
  RemotePromise(__return_storage_ptr__,promise_00,&local_90);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::~Pipeline(&local_90);
  AnyPointer::Pipeline::~Pipeline(&local_b8);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own(&local_c8);
  kj::_::
  Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
  ::~Tuple((Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>_>
            *)local_28);
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<T> RemotePromise<T>::reducePromise(kj::Promise<RemotePromise>&& promise) {
  kj::Tuple<kj::Promise<Response<T>>, kj::Promise<kj::Own<PipelineHook>>> splitPromise =
      promise.then([](RemotePromise&& inner) {
    // `inner` is multiply-inherited, and we want to move away each superclass separately.
    // Let's create two references to make clear what we're doing (though this is not strictly
    // necessary).
    kj::Promise<Response<T>>& innerPromise = inner;
    typename T::Pipeline& innerPipeline = inner;
    return kj::tuple(kj::mv(innerPromise), PipelineHook::from(kj::mv(innerPipeline)));
  }).split();

  return RemotePromise(kj::mv(kj::get<0>(splitPromise)),
      typename T::Pipeline(AnyPointer::Pipeline(
          newLocalPromisePipeline(kj::mv(kj::get<1>(splitPromise))))));
}